

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

void BZ2_hbMakeCodeLengths(UChar *len,Int32 *freq,Int32 alphaSize,Int32 maxLen)

{
  int iVar1;
  bool bVar2;
  Int32 IVar3;
  Int32 IVar4;
  int iVar5;
  uint local_14ac;
  int local_14a4;
  int local_149c;
  Int32 tmp_3;
  Int32 zz_3;
  Int32 tmp_2;
  Int32 yy_1;
  Int32 zz_2;
  Int32 tmp_1;
  Int32 yy;
  Int32 zz_1;
  Int32 tmp;
  Int32 zz;
  Int32 parent [516];
  Int32 weight [516];
  Int32 heap [260];
  int local_3c;
  int iStack_38;
  Bool tooLong;
  Int32 k;
  Int32 j;
  Int32 i;
  Int32 n2;
  Int32 n1;
  Int32 nHeap;
  Int32 nNodes;
  Int32 maxLen_local;
  Int32 alphaSize_local;
  Int32 *freq_local;
  UChar *len_local;
  
  for (k = 0; k < alphaSize; k = k + 1) {
    if (freq[k] == 0) {
      local_14a4 = 1;
    }
    else {
      local_14a4 = freq[k];
    }
    parent[(long)(k + 1) + 0x202] = local_14a4 << 8;
  }
  do {
    n2 = 0;
    weight[0x202] = 0;
    parent[0x202] = 0;
    tmp = -2;
    for (k = 1; k <= alphaSize; k = k + 1) {
      (&tmp)[k] = -1;
      n2 = n2 + 1;
      weight[(long)n2 + 0x202] = k;
      iVar1 = weight[(long)n2 + 0x202];
      zz_1 = n2;
      while (iVar5 = zz_1 >> 1,
            parent[(long)iVar1 + 0x202] < parent[(long)weight[(long)iVar5 + 0x202] + 0x202]) {
        weight[(long)zz_1 + 0x202] = weight[(long)iVar5 + 0x202];
        zz_1 = iVar5;
      }
      weight[(long)zz_1 + 0x202] = iVar1;
    }
    n1 = alphaSize;
    if (0x103 < n2) {
      BZ2_bz__AssertH__fail(0x7d1);
    }
    while (IVar3 = weight[0x203], 1 < n2) {
      iVar1 = weight[(long)n2 + 0x202];
      weight[0x203] = iVar1;
      iVar5 = n2 + -1;
      tmp_1 = 1;
      while (zz_2 = tmp_1 * 2, zz_2 <= iVar5) {
        if ((zz_2 < iVar5) &&
           (parent[(long)weight[(long)(zz_2 + 1) + 0x202] + 0x202] <
            parent[(long)weight[(long)zz_2 + 0x202] + 0x202])) {
          zz_2 = zz_2 + 1;
        }
        if (parent[(long)iVar1 + 0x202] < parent[(long)weight[(long)zz_2 + 0x202] + 0x202]) break;
        weight[(long)tmp_1 + 0x202] = weight[(long)zz_2 + 0x202];
        tmp_1 = zz_2;
      }
      weight[(long)tmp_1 + 0x202] = iVar1;
      IVar4 = weight[0x203];
      iVar1 = weight[(long)iVar5 + 0x202];
      weight[0x203] = iVar1;
      tmp_2 = 1;
      while (zz_3 = tmp_2 * 2, zz_3 <= n2 + -2) {
        if ((zz_3 < n2 + -2) &&
           (parent[(long)weight[(long)(zz_3 + 1) + 0x202] + 0x202] <
            parent[(long)weight[(long)zz_3 + 0x202] + 0x202])) {
          zz_3 = zz_3 + 1;
        }
        if (parent[(long)iVar1 + 0x202] < parent[(long)weight[(long)zz_3 + 0x202] + 0x202]) break;
        weight[(long)tmp_2 + 0x202] = weight[(long)zz_3 + 0x202];
        tmp_2 = zz_3;
      }
      weight[(long)tmp_2 + 0x202] = iVar1;
      n1 = n1 + 1;
      (&tmp)[IVar4] = n1;
      (&tmp)[IVar3] = n1;
      if ((parent[(long)IVar4 + 0x202] & 0xffU) < (parent[(long)IVar3 + 0x202] & 0xffU)) {
        local_14ac = parent[(long)IVar3 + 0x202];
      }
      else {
        local_14ac = parent[(long)IVar4 + 0x202];
      }
      local_14ac = local_14ac & 0xff;
      parent[(long)n1 + 0x202] =
           (parent[(long)IVar3 + 0x202] & 0xffffff00U) + (parent[(long)IVar4 + 0x202] & 0xffffff00U)
           | local_14ac + 1;
      (&tmp)[n1] = -1;
      n2 = n2 + -1;
      weight[(long)n2 + 0x202] = n1;
      iVar1 = weight[(long)n2 + 0x202];
      local_149c = n2;
      while (iVar5 = local_149c >> 1,
            parent[(long)iVar1 + 0x202] < parent[(long)weight[(long)iVar5 + 0x202] + 0x202]) {
        weight[(long)local_149c + 0x202] = weight[(long)iVar5 + 0x202];
        local_149c = iVar5;
      }
      weight[(long)local_149c + 0x202] = iVar1;
    }
    if (0x203 < n1) {
      BZ2_bz__AssertH__fail(0x7d2);
    }
    bVar2 = false;
    for (k = 1; k <= alphaSize; k = k + 1) {
      iStack_38 = 0;
      for (local_3c = k; -1 < (&tmp)[local_3c]; local_3c = (&tmp)[local_3c]) {
        iStack_38 = iStack_38 + 1;
      }
      len[k + -1] = (UChar)iStack_38;
      if (maxLen < iStack_38) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      return;
    }
    for (k = 1; k <= alphaSize; k = k + 1) {
      parent[(long)k + 0x202] = ((parent[(long)k + 0x202] >> 8) / 2 + 1) * 0x100;
    }
  } while( true );
}

Assistant:

void BZ2_hbMakeCodeLengths ( UChar *len, 
                             Int32 *freq,
                             Int32 alphaSize,
                             Int32 maxLen )
{
   /*--
      Nodes and heap entries run from 1.  Entry 0
      for both the heap and nodes is a sentinel.
   --*/
   Int32 nNodes, nHeap, n1, n2, i, j, k;
   Bool  tooLong;

   Int32 heap   [ BZ_MAX_ALPHA_SIZE + 2 ];
   Int32 weight [ BZ_MAX_ALPHA_SIZE * 2 ];
   Int32 parent [ BZ_MAX_ALPHA_SIZE * 2 ]; 

   for (i = 0; i < alphaSize; i++)
      weight[i+1] = (freq[i] == 0 ? 1 : freq[i]) << 8;

   while (True) {

      nNodes = alphaSize;
      nHeap = 0;

      heap[0] = 0;
      weight[0] = 0;
      parent[0] = -2;

      for (i = 1; i <= alphaSize; i++) {
         parent[i] = -1;
         nHeap++;
         heap[nHeap] = i;
         UPHEAP(nHeap);
      }

      AssertH( nHeap < (BZ_MAX_ALPHA_SIZE+2), 2001 );
   
      while (nHeap > 1) {
         n1 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         n2 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         nNodes++;
         parent[n1] = parent[n2] = nNodes;
         weight[nNodes] = ADDWEIGHTS(weight[n1], weight[n2]);
         parent[nNodes] = -1;
         nHeap++;
         heap[nHeap] = nNodes;
         UPHEAP(nHeap);
      }

      AssertH( nNodes < (BZ_MAX_ALPHA_SIZE * 2), 2002 );

      tooLong = False;
      for (i = 1; i <= alphaSize; i++) {
         j = 0;
         k = i;
         while (parent[k] >= 0) { k = parent[k]; j++; }
         len[i-1] = j;
         if (j > maxLen) tooLong = True;
      }
      
      if (! tooLong) break;

      /* 17 Oct 04: keep-going condition for the following loop used
         to be 'i < alphaSize', which missed the last element,
         theoretically leading to the possibility of the compressor
         looping.  However, this count-scaling step is only needed if
         one of the generated Huffman code words is longer than
         maxLen, which up to and including version 1.0.2 was 20 bits,
         which is extremely unlikely.  In version 1.0.3 maxLen was
         changed to 17 bits, which has minimal effect on compression
         ratio, but does mean this scaling step is used from time to
         time, enough to verify that it works.

         This means that bzip2-1.0.3 and later will only produce
         Huffman codes with a maximum length of 17 bits.  However, in
         order to preserve backwards compatibility with bitstreams
         produced by versions pre-1.0.3, the decompressor must still
         handle lengths of up to 20. */

      for (i = 1; i <= alphaSize; i++) {
         j = weight[i] >> 8;
         j = 1 + (j / 2);
         weight[i] = j << 8;
      }
   }
}